

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::
Petition(std::function<void(std::__cxx11::string_const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)
::$_0::~__0(__0 *this)

{
  anon_class_80_4_b999da52 *this_local;
  
  std::__cxx11::string::~string((string *)(this + 0x28));
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
               *)(this + 8));
  return;
}

Assistant:

Error CommissionerSafe::Petition(std::string &aExistingCommissionerId, const std::string &aAddr, uint16_t aPort)
{
    std::promise<Error> pro;
    auto wait = [&pro, &aExistingCommissionerId](const std::string *existingCommissionerId, Error error) {
        if (existingCommissionerId != nullptr)
        {
            aExistingCommissionerId = *existingCommissionerId;
        }
        pro.set_value(error);
    };

    Petition(wait, aAddr, aPort);
    return pro.get_future().get();
}